

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::declare_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  ostringstream buf;
  DeclareVariable local_1e8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)((long)this + 8),*(long *)((long)this + 0x10));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"{\n",2);
  if (0 < (int)((ulong)(*(long *)((long)this + 0x50) - *(long *)((long)this + 0x48)) >> 3) *
          -0x49249249) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\t",1);
      glu::decl::DeclareVariable::DeclareVariable
                (&local_1e8,(VarType *)(*(long *)((long)this + 0x48) + lVar2 + 0x20),
                 (string *)(*(long *)((long)this + 0x48) + lVar2),0);
      poVar1 = glu::decl::operator<<((ostream *)local_1a8,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.name._M_dataplus._M_p != &local_1e8.name.field_2) {
        operator_delete(local_1e8.name._M_dataplus._M_p,
                        local_1e8.name.field_2._M_allocated_capacity + 1);
      }
      glu::VarType::~VarType(&local_1e8.varType);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while (lVar3 < (int)((ulong)(*(long *)((long)this + 0x50) - *(long *)((long)this + 0x48)) >> 3
                          ) * -0x49249249);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"} ",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,*(char **)((long)this + 0x28),
                      *(long *)((long)this + 0x30));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::declare (void) const
{
	std::ostringstream buf;

	buf << m_blockName << "\n"
		<< "{\n";

	for (int i = 0; i < (int)m_members.size(); i++)
		buf << "\t" << glu::declare(m_members[i].type, m_members[i].name) << ";\n";

	buf << "} " << m_interfaceName << ";\n";
	return buf.str();
}